

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<float> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  float_specs in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char in_R8B;
  int num_zeros;
  int num_zeros_3;
  int num_zeros_2;
  int exp;
  anon_class_28_7_94dcc806 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  iterator in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int value;
  undefined4 in_stack_fffffffffffffe94;
  undefined2 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9a;
  undefined1 in_stack_fffffffffffffe9b;
  undefined4 in_stack_fffffffffffffe9c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  int local_124;
  basic_format_specs<char> *local_120;
  char *local_118;
  int *local_110;
  int *local_108;
  undefined1 *local_100;
  int *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  int local_e4;
  basic_format_specs<char> *local_e0;
  char *local_d8;
  int *local_d0;
  undefined4 *local_c8;
  float_specs *local_c0;
  undefined1 *local_b8;
  int *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  int local_a0;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  uint local_84;
  char local_80;
  undefined1 uStack_7f;
  char cStack_7e;
  char cStack_7d;
  int local_7c;
  char local_78;
  int local_74;
  undefined1 local_70;
  int local_6c;
  undefined1 local_65;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  anon_class_12_2_f0c9b3c6 local_50;
  int local_44;
  ulong local_40;
  basic_format_specs<char> local_38;
  int *local_28;
  undefined4 *local_20;
  float_specs local_18;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_38._8_4_ = *in_RSI;
  local_38._15_1_ = in_R8B;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RCX;
  local_10.container = in_RDI;
  local_38.precision = get_significand_size<float>((decimal_fp<float> *)0x16401f);
  local_38.width = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(local_38.precision);
  local_40 = (ulong)(tVar2 + (local_38.width != 0));
  local_50.output_exp = local_20[1] + local_38.precision + -1;
  local_50.fspecs = local_18;
  local_44 = local_50.output_exp;
  bVar1 = write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_50);
  if (bVar1) {
    local_54 = 0;
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_38.precision == 1) {
        local_38._15_1_ = '\0';
      }
    }
    else {
      local_58 = local_18.precision - local_38.precision;
      local_5c = 0;
      piVar4 = std::max<int>(&local_58,&local_5c);
      local_54 = *piVar4;
      tVar2 = to_unsigned<int>(local_54);
      local_40 = tVar2 + local_40;
    }
    iVar3 = local_44;
    if (local_44 < 0) {
      iVar3 = -local_44;
    }
    local_64 = 2;
    if ((99 < iVar3) && (local_64 = 3, 999 < iVar3)) {
      local_64 = 4;
    }
    local_60 = iVar3;
    tVar2 = to_unsigned<int>((local_38._15_1_ != '\0') + 2 + local_64);
    local_40 = tVar2 + local_40;
    local_70 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      local_70 = 0x65;
    }
    local_84 = local_38.width;
    local_80 = local_38.type;
    uStack_7f = local_38._9_1_;
    cStack_7e = local_38.fill.data_[0];
    cStack_7d = local_38.fill.data_[1];
    local_7c = local_38.precision;
    local_78 = local_38._15_1_;
    local_74 = local_54;
    local_6c = local_44;
    local_65 = local_70;
    if (*local_28 < 1) {
      local_98 = local_10.container;
      reserve<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_stack_fffffffffffffea0,
                 CONCAT44(iVar3,CONCAT13(local_70,CONCAT12(0x65,in_stack_fffffffffffffe98))));
      pcVar5 = write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
               ::anon_class_28_7_94dcc806::operator()
                         ((anon_class_28_7_94dcc806 *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88);
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                base_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_10,pcVar5);
    }
    else {
      local_90 = local_10.container;
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                          (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0.container,
                           CONCAT44(iVar3,CONCAT13(local_70,CONCAT12(0x65,in_stack_fffffffffffffe98)
                                                  )),
                           (anon_class_28_7_94dcc806 *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
  }
  else {
    local_9c = local_20[1] + local_38.precision;
    if ((int)local_20[1] < 0) {
      if (local_9c < 1) {
        local_124 = -local_9c;
        if (((local_38.precision == 0) && (-1 < local_18.precision)) &&
           (local_18.precision < local_124)) {
          local_124 = local_18.precision;
        }
        tVar2 = to_unsigned<int>(local_124);
        local_40 = (tVar2 + 2) + local_40;
        local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_124,&local_38,
                             CONCAT44(in_stack_fffffffffffffe9c,
                                      CONCAT13(in_stack_fffffffffffffe9b,
                                               CONCAT12(in_stack_fffffffffffffe9a,
                                                        in_stack_fffffffffffffe98))),
                             (anon_class_48_6_9afe1116 *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_18.precision - local_38.precision;
        }
        value = iVar3;
        if (iVar3 < 1) {
          value = 0;
        }
        local_e4 = iVar3;
        tVar2 = to_unsigned<int>(value);
        local_40 = (tVar2 + 1) + local_40;
        local_f0 = local_10.container;
        local_120 = &local_38;
        local_118 = &local_38.type;
        local_110 = &local_38.precision;
        local_108 = &local_9c;
        local_100 = &local_38.field_0xf;
        local_f8 = &local_e4;
        local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_>
                            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0.container,
                             CONCAT44(in_stack_fffffffffffffe9c,
                                      CONCAT13(in_stack_fffffffffffffe9b,
                                               CONCAT12(in_stack_fffffffffffffe9a,
                                                        in_stack_fffffffffffffe98))),
                             (anon_class_48_6_48d028d1 *)CONCAT44(iVar3,value));
      }
    }
    else {
      tVar2 = to_unsigned<int>(local_20[1]);
      local_40 = tVar2 + local_40;
      local_a0 = local_18.precision - local_9c;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_a0 < 1) && (local_18._4_1_ != '\x02')) {
          local_a0 = 1;
        }
        if (0 < local_a0) {
          tVar2 = to_unsigned<int>(local_a0);
          local_40 = tVar2 + local_40;
        }
      }
      local_a8 = local_10.container;
      local_e0 = &local_38;
      local_d8 = &local_38.type;
      local_d0 = &local_38.precision;
      local_c8 = local_20;
      local_c0 = &local_18;
      local_b8 = &local_38.field_0xf;
      local_b0 = &local_a0;
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_>
                          (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0.container,
                           CONCAT44(in_stack_fffffffffffffe9c,
                                    CONCAT13(in_stack_fffffffffffffe9b,
                                             CONCAT12(in_stack_fffffffffffffe9a,
                                                      in_stack_fffffffffffffe98))),
                           (anon_class_56_7_a2a26a24 *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )local_8;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}